

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpFixedLengthEntityWriter::pumpFrom
          (HttpFixedLengthEntityWriter *this,AsyncInputStream *input,uint64_t amount)

{
  Coroutine<unsigned_long> *this_00;
  AsyncInputStream *pAVar1;
  long *plVar2;
  HttpOutputStream *this_01;
  PromiseAwaiter<unsigned_long> *pPVar3;
  Promise<unsigned_long> *promise;
  HttpEntityBodyWriter *this_02;
  PromiseArenaMember *pPVar4;
  SourceLocation location;
  bool bVar5;
  coroutine_handle<void> coroutine;
  _func_int **pp_Var6;
  unsigned_long uVar7;
  _func_int **in_RCX;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  Fault f;
  NullableValue<unsigned_long> _available2505;
  
  coroutine._M_fr_ptr = operator_new(0x620);
  *(code **)coroutine._M_fr_ptr = pumpFrom;
  *(code **)((long)coroutine._M_fr_ptr + 8) = pumpFrom;
  this_00 = (Coroutine<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x10);
  *(_func_int ***)((long)coroutine._M_fr_ptr + 0x5f8) = in_RCX;
  *(uint64_t *)((long)coroutine._M_fr_ptr + 0x5f0) = amount;
  *(AsyncInputStream **)((long)coroutine._M_fr_ptr + 0x5e8) = input;
  _kjCondition.left = (unsigned_long *)anon_var_dwarf_7a3518;
  _kjCondition.right = (unsigned_long *)0x4ab4a3;
  _kjCondition.op.content.ptr = (char *)0x15000009c1;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006094f8;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00609540;
  location.function = "pumpFrom";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x9c1;
  location.columnNumber = 0x15;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006094f8;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00609540;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpEntityBodyWriter).super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)this_00;
  if (in_RCX == (_func_int **)0x0) {
    *(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x5c8) = 0;
    kj::_::Coroutine<unsigned_long>::fulfill
              (this_00,(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x5c8));
    goto LAB_0039b135;
  }
  pAVar1 = input + 3;
  pp_Var6 = input[3]._vptr_AsyncInputStream;
  *(_func_int ***)((long)coroutine._M_fr_ptr + 0x600) = pp_Var6;
  if (pp_Var6 < in_RCX) {
    (**(code **)(*(long *)amount + 0x10))(&_kjCondition,amount);
    _available2505.isSet = (bool)(char)_kjCondition.left;
    if ((char)_kjCondition.left == '\x01') {
      _kjCondition.left = (unsigned_long *)&_available2505.field_1;
      _available2505.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)_kjCondition.right;
      pp_Var6 = pAVar1->_vptr_AsyncInputStream;
      _kjCondition.op.content.ptr = " <= ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = _kjCondition.right <= pp_Var6;
      bVar5 = pp_Var6 < _kjCondition.right;
      _kjCondition.right = (unsigned_long *)pAVar1;
      if (bVar5) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[25]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x9cc,FAILED,"available <= length","_kjCondition,\"overwrote Content-Length\"",
                   &_kjCondition,(char (*) [25])"overwrote Content-Length");
        kj::_::Debug::Fault::fatal(&f);
      }
    }
    else {
      pp_Var6 = pAVar1->_vptr_AsyncInputStream;
    }
    if (pp_Var6 <= in_RCX) {
      in_RCX = pp_Var6;
    }
    pAVar1->_vptr_AsyncInputStream = (_func_int **)((long)pp_Var6 - (long)in_RCX);
    if (pp_Var6 != (_func_int **)0x0) goto LAB_0039af66;
    pp_Var6 = (_func_int **)0x0;
  }
  else {
    pAVar1->_vptr_AsyncInputStream = (_func_int **)((long)pp_Var6 - (long)in_RCX);
LAB_0039af66:
    *(_func_int ***)((long)coroutine._M_fr_ptr + 0x608) = in_RCX;
    this_02 = (HttpEntityBodyWriter *)input[1]._vptr_AsyncInputStream;
    HttpEntityBodyWriter::getInner(this_02);
    this_01 = (HttpOutputStream *)((long)coroutine._M_fr_ptr + 0x5d0);
    HttpOutputStream::pumpBodyFrom(this_01,(AsyncInputStream *)this_02,amount);
    pPVar3 = (PromiseAwaiter<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x240);
    co_await<unsigned_long>(pPVar3,(Promise<unsigned_long> *)this_01);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x618) = 0;
    bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar3,(CoroutineBase *)this_00);
    if (bVar5) {
      return (PromiseBase)(PromiseBase)this;
    }
    pp_Var6 = (_func_int **)kj::_::PromiseAwaiter<unsigned_long>::await_resume(pPVar3);
    if (*(char *)((long)coroutine._M_fr_ptr + 600) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x260));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar3);
    pPVar4 = (PromiseArenaMember *)
             (this_01->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
             currentWrapper.ptr;
    if (pPVar4 != (PromiseArenaMember *)0x0) {
      (this_01->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
      currentWrapper.ptr = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar4);
    }
    plVar2 = (long *)(*(long *)((long)coroutine._M_fr_ptr + 0x5e8) + 0x18);
    *plVar2 = *plVar2 + (*(long *)((long)coroutine._M_fr_ptr + 0x608) - (long)pp_Var6);
    if (*plVar2 == 0) {
      HttpEntityBodyWriter::doneWriting
                (*(HttpEntityBodyWriter **)((long)coroutine._M_fr_ptr + 0x5e8));
    }
    in_RCX = *(_func_int ***)((long)coroutine._M_fr_ptr + 0x608);
  }
  *(_func_int ***)((long)coroutine._M_fr_ptr + 0x610) = pp_Var6;
  if ((pp_Var6 == in_RCX) &&
     (*(ulong *)((long)coroutine._M_fr_ptr + 0x600) < *(ulong *)((long)coroutine._M_fr_ptr + 0x5f8))
     ) {
    promise = (Promise<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x5e0);
    (**(code **)(**(long **)((long)coroutine._M_fr_ptr + 0x5f0) + 8))
              (promise,*(long **)((long)coroutine._M_fr_ptr + 0x5f0),&pumpFrom::junk,1,1);
    pPVar3 = (PromiseAwaiter<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x400);
    co_await<unsigned_long>(pPVar3,promise);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x618) = 1;
    bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar3,(CoroutineBase *)this_00);
    if (bVar5) {
      return (PromiseBase)(PromiseBase)this;
    }
    uVar7 = kj::_::PromiseAwaiter<unsigned_long>::await_resume(pPVar3);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x418) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x420));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar3);
    pPVar4 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
    if (pPVar4 != (PromiseArenaMember *)0x0) {
      (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar4);
    }
    _kjCondition.left = (unsigned_long *)((long)coroutine._M_fr_ptr + 0x5d8);
    *_kjCondition.left = uVar7;
    _kjCondition.right = (unsigned_long *)((ulong)_kjCondition.right & 0xffffffff00000000);
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = uVar7 == 0;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[25]>
                ((Fault *)&_available2505,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x9e2,FAILED,"extra == 0","_kjCondition,\"overwrote Content-Length\"",
                 (DebugComparison<unsigned_long_&,_int> *)&_kjCondition,
                 (char (*) [25])"overwrote Content-Length");
      kj::_::Debug::Fault::fatal((Fault *)&_available2505);
    }
    pp_Var6 = *(_func_int ***)((long)coroutine._M_fr_ptr + 0x610);
  }
  *(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x5c0) = (FixVoid<unsigned_long>)pp_Var6;
  kj::_::Coroutine<unsigned_long>::fulfill
            (this_00,(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x5c0));
LAB_0039b135:
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x618) = 2;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> pumpFrom(AsyncInputStream& input, uint64_t amount) {
    if (amount == 0) co_return 0;

    bool overshot = amount > length;
    if (overshot) {
      // Hmm, the requested amount was too large, but it's common to specify kj::max as the amount
      // to pump, in which case we pump to EOF. Let's try to verify whether EOF is where we
      // expect it to be.
      KJ_IF_SOME(available, input.tryGetLength()) {
        // Great, the stream knows how large it is. If it's indeed larger than the space available
        // then let's abort.
        KJ_REQUIRE(available <= length, "overwrote Content-Length");
      } else {
        // OK, we have no idea how large the input is, so we'll have to check later.
      }
    }

    amount = kj::min(amount, length);
    length -= amount;
    uint64_t actual = amount;

    if (amount != 0) {
      actual = co_await getInner().pumpBodyFrom(input, amount);
      length += amount - actual;
      if (length == 0) doneWriting();
    }

    if (overshot) {
        if (actual == amount) {
          // We read exactly the amount expected. In order to detect an overshoot, we have to
          // try reading one more byte. Ugh.
          static byte junk;
          auto extra = co_await input.tryRead(&junk, 1, 1);
          KJ_REQUIRE(extra == 0, "overwrote Content-Length");
        } else {
          // We actually read less data than requested so we couldn't have overshot. In fact, we
          // undershot.
        }
    }

    co_return actual;
  }